

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int gauden_massage_var(vector_t ***var,float32 fudge_factor,uint32 n_mgau,uint32 n_stream,
                      uint32 n_density,uint32 *veclen)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  for (uVar3 = 0; uVar3 != n_stream; uVar3 = uVar3 + 1) {
    uVar1 = veclen[uVar3];
    for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; uVar5 != n_mgau; uVar5 = uVar5 + 1) {
        for (uVar2 = 0; n_density != uVar2; uVar2 = uVar2 + 1) {
          var[uVar5][uVar3][uVar2][uVar4] = var[uVar5][uVar3][uVar2][uVar4] * (float)fudge_factor;
        }
      }
    }
  }
  return 0;
}

Assistant:

int
gauden_massage_var(vector_t ***var,
		  float32 fudge_factor,
		  uint32 n_mgau,
		  uint32 n_stream,
		  uint32 n_density,
		  const uint32 *veclen)
{
    uint32 i, j, k, l;
    
    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    for (i = 0; i < n_mgau; i++) {
		for (k = 0; k < n_density; k++) {
		    var[i][j][k][l] *= fudge_factor;
		}
	    }
	}
    }

    return S3_SUCCESS;
}